

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

array * cs_impl::string_cs_ext::split(array *__return_storage_ptr__,string *str,array *signals)

{
  char cVar1;
  _Elt_pointer paVar2;
  char *pcVar3;
  char *ch;
  char *pcVar4;
  _Elt_pointer paVar5;
  _Elt_pointer this;
  char *pcVar6;
  _Map_pointer ppaVar7;
  string buf;
  array arr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  char *local_a0;
  array *local_98;
  _Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> *local_90;
  _Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_98 = signals;
  std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_M_initialize_map(&local_88,0);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  if (str->_M_string_length != 0) {
    pcVar4 = (str->_M_dataplus)._M_p;
    local_a0 = pcVar4 + str->_M_string_length;
    local_90 = &__return_storage_ptr__->
                super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>;
    do {
      this = (local_98->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_start._M_cur;
      paVar2 = (local_98->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (this != paVar2) {
        paVar5 = (local_98->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_last;
        ppaVar7 = (local_98->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                  .super__Deque_impl_data._M_start._M_node;
        do {
          cVar1 = *pcVar4;
          pcVar3 = any::const_val<char>(this);
          pcVar6 = local_a0;
          if (cVar1 == *pcVar3) {
            if (local_c0._M_string_length != 0) {
              std::deque<cs_impl::any,std::allocator<cs_impl::any>>::
              emplace_back<std::__cxx11::string&>
                        ((deque<cs_impl::any,std::allocator<cs_impl::any>> *)&local_88,&local_c0);
              local_c0._M_string_length = 0;
              *local_c0._M_dataplus._M_p = '\0';
            }
            goto LAB_0020907c;
          }
          this = this + 1;
          if (this == paVar5) {
            this = ppaVar7[1];
            ppaVar7 = ppaVar7 + 1;
            paVar5 = this + 0x40;
          }
        } while (this != paVar2);
      }
      std::__cxx11::string::push_back((char)&local_c0);
      pcVar6 = local_a0;
LAB_0020907c:
      __return_storage_ptr__ = (array *)local_90;
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 != pcVar6);
    if (local_c0._M_string_length != 0) {
      std::deque<cs_impl::any,std::allocator<cs_impl::any>>::emplace_back<std::__cxx11::string&>
                ((deque<cs_impl::any,std::allocator<cs_impl::any>> *)&local_88,&local_c0);
    }
  }
  std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_Deque_base
            (&__return_storage_ptr__->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>
             ,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque
            ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_88);
  return (array *)&__return_storage_ptr__->
                   super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>;
}

Assistant:

array split(const string &str, const array &signals)
		{
			array
			arr;
			string buf;
			bool found = false;
			for (auto &ch: str) {
				for (auto &sig: signals) {
					if (ch == sig.const_val<char>()) {
						if (!buf.empty()) {
							arr.emplace_back(buf);
							buf.clear();
						}
						found = true;
						break;
					}
				}
				if (found)
					found = false;
				else
					buf.push_back(ch);
			}
			if (!buf.empty())
				arr.emplace_back(buf);
			return std::move(arr);
		}